

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderProperties.cpp
# Opt level: O1

IterateResult __thiscall
glcts::TessellationShaderPropertiesProgramObject::iterate
          (TessellationShaderPropertiesProgramObject *this)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *pTVar5;
  NotSupportedError *this_00;
  _test_descriptor *p_Var6;
  _tests tests;
  GLint gen_point_mode_value;
  GLint gen_vertex_order_value;
  GLint gen_spacing_value;
  GLint gen_mode_value;
  GLint control_output_vertices_value;
  GLint link_status;
  GLint te_compile_status;
  GLint tc_compile_status;
  _test_descriptor test_2;
  _test_descriptor test_3;
  _test_descriptor test_1;
  _test_descriptor test_4;
  _test_descriptor *local_2a8;
  iterator iStack_2a0;
  _test_descriptor *local_298;
  GLenum local_288;
  GLenum local_284;
  GLenum local_280;
  GLenum local_27c;
  int local_278;
  int local_274;
  int local_270;
  int local_26c;
  _test_descriptor local_268;
  _test_descriptor local_238;
  _test_descriptor local_208;
  _test_descriptor local_1d8;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  long lVar4;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"Tessellation shader functionality not supported, skipping","");
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_1b0);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTest(this);
  local_208.expected_gen_mode_value = (this->super_TestCaseBase).m_glExtTokens.QUADS;
  local_208.expected_control_output_vertices_value = 4;
  local_208.expected_gen_point_mode_value = 0;
  local_208.expected_gen_spacing_value = 0x202;
  local_208.expected_gen_vertex_order_value = 0x901;
  local_208.tc_body =
       "${VERSION}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(vertices=4) out;\n\nvoid main()\n{\n    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n}\n"
  ;
  local_208.te_body =
       "${VERSION}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(quads) in;\n\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n}\n"
  ;
  local_268.expected_gen_mode_value = (this->super_TestCaseBase).m_glExtTokens.ISOLINES;
  local_268.expected_control_output_vertices_value = 0x10;
  local_268._8_8_ = (ulong)(this->super_TestCaseBase).m_glExtTokens.FRACTIONAL_EVEN << 0x20;
  local_268.expected_gen_vertex_order_value = 0x900;
  local_268.tc_body =
       "${VERSION}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(vertices=16) out;\n\nvoid main()\n{\n    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n}\n"
  ;
  local_268.te_body =
       "${VERSION}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(isolines, fractional_even_spacing, cw) in;\n\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n}\n"
  ;
  local_238.expected_control_output_vertices_value = 0x20;
  local_238.expected_gen_mode_value = 4;
  local_238.expected_gen_spacing_value = (this->super_TestCaseBase).m_glExtTokens.FRACTIONAL_ODD;
  local_238.expected_gen_point_mode_value = 1;
  local_238.expected_gen_vertex_order_value = 0x901;
  local_238.tc_body =
       "${VERSION}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(vertices=32) out;\n\nvoid main()\n{\n    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n}\n"
  ;
  local_238.te_body =
       "${VERSION}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(triangles, fractional_odd_spacing, ccw, point_mode) in;\n\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n}\n"
  ;
  local_1d8.expected_gen_mode_value = local_208.expected_gen_mode_value;
  local_1d8.expected_control_output_vertices_value = 8;
  local_1d8.expected_gen_point_mode_value = 1;
  local_1d8.expected_gen_spacing_value = 0x202;
  local_1d8.expected_gen_vertex_order_value = 0x901;
  local_1d8.tc_body =
       "${VERSION}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(vertices=8) out;\n\nvoid main()\n{\n    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n}\n"
  ;
  local_1d8.te_body =
       "${VERSION}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(quads, equal_spacing, ccw, point_mode) in;\n\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n}\n"
  ;
  local_2a8 = (_test_descriptor *)0x0;
  iStack_2a0._M_current = (_test_descriptor *)0x0;
  local_298 = (_test_descriptor *)0x0;
  std::
  vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>>
  ::_M_realloc_insert<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor_const&>
            ((vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>>
              *)&local_2a8,(iterator)0x0,&local_208);
  if (iStack_2a0._M_current == local_298) {
    std::
    vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>>
    ::_M_realloc_insert<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor_const&>
              ((vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>>
                *)&local_2a8,iStack_2a0,&local_268);
  }
  else {
    (iStack_2a0._M_current)->te_body = local_268.te_body;
    *(ulong *)&(iStack_2a0._M_current)->expected_gen_vertex_order_value =
         CONCAT44(local_268._20_4_,local_268.expected_gen_vertex_order_value);
    (iStack_2a0._M_current)->tc_body = local_268.tc_body;
    (iStack_2a0._M_current)->expected_control_output_vertices_value =
         local_268.expected_control_output_vertices_value;
    (iStack_2a0._M_current)->expected_gen_mode_value = local_268.expected_gen_mode_value;
    (iStack_2a0._M_current)->expected_gen_point_mode_value = local_268.expected_gen_point_mode_value
    ;
    (iStack_2a0._M_current)->expected_gen_spacing_value = local_268.expected_gen_spacing_value;
    iStack_2a0._M_current = iStack_2a0._M_current + 1;
  }
  if (iStack_2a0._M_current == local_298) {
    std::
    vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>>
    ::_M_realloc_insert<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor_const&>
              ((vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>>
                *)&local_2a8,iStack_2a0,&local_238);
  }
  else {
    (iStack_2a0._M_current)->te_body = local_238.te_body;
    *(ulong *)&(iStack_2a0._M_current)->expected_gen_vertex_order_value =
         CONCAT44(local_238._20_4_,local_238.expected_gen_vertex_order_value);
    (iStack_2a0._M_current)->tc_body = local_238.tc_body;
    (iStack_2a0._M_current)->expected_control_output_vertices_value =
         local_238.expected_control_output_vertices_value;
    (iStack_2a0._M_current)->expected_gen_mode_value = local_238.expected_gen_mode_value;
    (iStack_2a0._M_current)->expected_gen_point_mode_value = local_238.expected_gen_point_mode_value
    ;
    (iStack_2a0._M_current)->expected_gen_spacing_value = local_238.expected_gen_spacing_value;
    iStack_2a0._M_current = iStack_2a0._M_current + 1;
  }
  if (iStack_2a0._M_current == local_298) {
    std::
    vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>>
    ::_M_realloc_insert<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor_const&>
              ((vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>>
                *)&local_2a8,iStack_2a0,&local_1d8);
  }
  else {
    (iStack_2a0._M_current)->te_body = local_1d8.te_body;
    *(ulong *)&(iStack_2a0._M_current)->expected_gen_vertex_order_value =
         CONCAT44(local_1d8._20_4_,local_1d8.expected_gen_vertex_order_value);
    (iStack_2a0._M_current)->tc_body = local_1d8.tc_body;
    (iStack_2a0._M_current)->expected_control_output_vertices_value =
         local_1d8.expected_control_output_vertices_value;
    (iStack_2a0._M_current)->expected_gen_mode_value = local_1d8.expected_gen_mode_value;
    (iStack_2a0._M_current)->expected_gen_point_mode_value = local_1d8.expected_gen_point_mode_value
    ;
    (iStack_2a0._M_current)->expected_gen_spacing_value = local_1d8.expected_gen_spacing_value;
    iStack_2a0._M_current = iStack_2a0._M_current + 1;
  }
  p_Var6 = local_2a8;
  if (local_2a8 != iStack_2a0._M_current) {
    do {
      TestCaseBase::shaderSourceSpecialized
                (&this->super_TestCaseBase,this->m_tc_id,1,&p_Var6->tc_body);
      TestCaseBase::shaderSourceSpecialized
                (&this->super_TestCaseBase,this->m_te_id,1,&p_Var6->te_body);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glShaderSource() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                      ,0x19e);
      (**(code **)(lVar4 + 0x248))(this->m_tc_id);
      (**(code **)(lVar4 + 0x248))(this->m_te_id);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glCompileShader() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                      ,0x1a4);
      local_26c = 0;
      local_270 = 0;
      (**(code **)(lVar4 + 0xa70))(this->m_tc_id,0x8b81,&local_26c);
      (**(code **)(lVar4 + 0xa70))(this->m_te_id,0x8b81,&local_270);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glGetShaderiv() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                      ,0x1ad);
      if (local_26c != 1) {
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Could not compile tessellation control shader",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                   ,0x1b1);
LAB_00d482ae:
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (local_270 != 1) {
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Could not compile tessellation evaluation shader",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                   ,0x1b6);
        goto LAB_00d482ae;
      }
      local_274 = 0;
      (**(code **)(lVar4 + 0xce8))(this->m_po_id);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glLinkProgram() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                      ,0x1bd);
      (**(code **)(lVar4 + 0x9d8))(this->m_po_id,0x8b82,&local_274);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glGetProgramiv() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                      ,0x1c0);
      if (local_274 != 1) {
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Program linking failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                   ,0x1c4);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      local_278 = 0;
      local_27c = 0;
      local_280 = 0;
      local_284 = 0;
      local_288 = 0;
      (**(code **)(lVar4 + 0x9d8))
                (this->m_po_id,(this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_OUTPUT_VERTICES
                 ,&local_278);
      (**(code **)(lVar4 + 0x9d8))
                (this->m_po_id,(this->super_TestCaseBase).m_glExtTokens.TESS_GEN_MODE,&local_27c);
      (**(code **)(lVar4 + 0x9d8))
                (this->m_po_id,(this->super_TestCaseBase).m_glExtTokens.TESS_GEN_SPACING,&local_280)
      ;
      (**(code **)(lVar4 + 0x9d8))
                (this->m_po_id,(this->super_TestCaseBase).m_glExtTokens.TESS_GEN_POINT_MODE,
                 &local_288);
      (**(code **)(lVar4 + 0x9d8))
                (this->m_po_id,(this->super_TestCaseBase).m_glExtTokens.TESS_GEN_VERTEX_ORDER,
                 &local_284);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glGetProgramiv() for tessellation-specific properties failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                      ,0x1d4);
      if (local_278 != p_Var6->expected_control_output_vertices_value) {
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "Invalid value reported for GL_TESS_CONTROL_OUTPUT_VERTICES_EXT property; ",0x49)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," expected: ",0xb);
        std::ostream::operator<<(poVar1,p_Var6->expected_control_output_vertices_value);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", retrieved: ",0xd);
        std::ostream::operator<<(poVar1,local_278);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Invalid value reported for GL_TESS_CONTROL_OUTPUT_VERTICES_EXT property."
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                   ,0x1dd);
LAB_00d486ca:
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (local_27c != p_Var6->expected_gen_mode_value) {
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Invalid value reported for GL_TESS_GEN_MODE_EXT property; ",
                   0x3a);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," expected: ",0xb);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", retrieved: ",0xd);
        std::ostream::operator<<(poVar1,local_27c);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Invalid value reported for GL_TESS_GEN_MODE_EXT property.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                   ,0x1e6);
        goto LAB_00d486ca;
      }
      if (local_280 != p_Var6->expected_gen_spacing_value) {
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Invalid value reported for GL_TESS_GEN_SPACING_EXT property; "
                   ,0x3d);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," expected: ",0xb);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", retrieved: ",0xd);
        std::ostream::operator<<(poVar1,local_280);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Invalid value reported for GL_TESS_GEN_SPACING_EXT property.",(char *)0x0
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                   ,0x1f0);
        goto LAB_00d486ca;
      }
      if (local_288 != p_Var6->expected_gen_point_mode_value) {
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "Invalid value reported for GL_TESS_GEN_POINT_MODE_EXT property; ",0x40);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," expected: ",0xb);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", retrieved: ",0xd);
        std::ostream::operator<<(poVar1,local_288);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Invalid value reported for GL_TESS_GEN_POINT_MODE_EXT property.",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                   ,0x1fa);
        goto LAB_00d486ca;
      }
      if (local_284 != p_Var6->expected_gen_vertex_order_value) {
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "Invalid value reported for GL_TESS_GEN_VERTEX_ORDER_EXT property; ",0x42);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," expected: ",0xb);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", retrieved: ",0xd);
        std::ostream::operator<<(poVar1,local_284);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Invalid value reported for GL_TESS_GEN_VERTEX_ORDER_EXT property.",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                   ,0x204);
        goto LAB_00d486ca;
      }
      p_Var6 = p_Var6 + 1;
    } while (p_Var6 != iStack_2a0._M_current);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  if (local_2a8 != (_test_descriptor *)0x0) {
    operator_delete(local_2a8,(long)local_298 - (long)local_2a8);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderPropertiesProgramObject::iterate(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize ES test objects */
	initTest();

	/* Test 1: Default values. Values as per spec, define as little qualifiers as possible */
	_test_descriptor test_1;

	test_1.expected_control_output_vertices_value = 4;
	test_1.expected_gen_mode_value				  = m_glExtTokens.QUADS;
	test_1.expected_gen_point_mode_value		  = GL_FALSE;
	test_1.expected_gen_spacing_value			  = GL_EQUAL;
	test_1.expected_gen_vertex_order_value		  = GL_CCW;
	test_1.tc_body								  = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(vertices=4) out;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
					 "}\n";
	test_1.te_body = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(quads) in;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_Position = gl_in[0].gl_Position;\n"
					 "}\n";

	/* Test 2: 16 vertices per patch + isolines + fractional_even_spacing + cw combination */
	_test_descriptor test_2;

	test_2.expected_control_output_vertices_value = 16;
	test_2.expected_gen_mode_value				  = m_glExtTokens.ISOLINES;
	test_2.expected_gen_point_mode_value		  = GL_FALSE;
	test_2.expected_gen_spacing_value			  = m_glExtTokens.FRACTIONAL_EVEN;
	test_2.expected_gen_vertex_order_value		  = GL_CW;
	test_2.tc_body								  = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(vertices=16) out;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
					 "}\n";
	test_2.te_body = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(isolines, fractional_even_spacing, cw) in;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_Position = gl_in[0].gl_Position;\n"
					 "}\n";

	/* Test 3: 32 vertices per patch + triangles + fractional_odd_spacing + ccw combination + point mode*/
	_test_descriptor test_3;

	test_3.expected_control_output_vertices_value = 32;
	test_3.expected_gen_mode_value				  = GL_TRIANGLES;
	test_3.expected_gen_point_mode_value		  = GL_TRUE;
	test_3.expected_gen_spacing_value			  = m_glExtTokens.FRACTIONAL_ODD;
	test_3.expected_gen_vertex_order_value		  = GL_CCW;
	test_3.tc_body								  = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(vertices=32) out;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
					 "}\n";
	test_3.te_body = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(triangles, fractional_odd_spacing, ccw, point_mode) in;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_Position = gl_in[0].gl_Position;\n"
					 "}\n";

	/* Test 4: 8 vertices per patch + quads + equal_spacing + ccw combination + point mode*/
	_test_descriptor test_4;

	test_4.expected_control_output_vertices_value = 8;
	test_4.expected_gen_mode_value				  = m_glExtTokens.QUADS;
	test_4.expected_gen_point_mode_value		  = GL_TRUE;
	test_4.expected_gen_spacing_value			  = GL_EQUAL;
	test_4.expected_gen_vertex_order_value		  = GL_CCW;
	test_4.tc_body								  = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(vertices=8) out;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
					 "}\n";
	test_4.te_body = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(quads, equal_spacing, ccw, point_mode) in;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_Position = gl_in[0].gl_Position;\n"
					 "}\n";

	/* Store all tests in a single vector */
	_tests tests;

	tests.push_back(test_1);
	tests.push_back(test_2);
	tests.push_back(test_3);
	tests.push_back(test_4);

	/* Iterate through all the tests and verify the values reported */
	for (_tests_const_iterator test_iterator = tests.begin(); test_iterator != tests.end(); test_iterator++)
	{
		const _test_descriptor& test = *test_iterator;

		/* Set tessellation control & evaluation shader bodies. */
		shaderSourceSpecialized(m_tc_id, 1 /* count */, &test.tc_body);
		shaderSourceSpecialized(m_te_id, 1 /* count */, &test.te_body);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed");

		/* Compile the shaders */
		gl.compileShader(m_tc_id);
		gl.compileShader(m_te_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() failed");

		/* Make sure the shaders compiled */
		glw::GLint tc_compile_status = GL_FALSE;
		glw::GLint te_compile_status = GL_FALSE;

		gl.getShaderiv(m_tc_id, GL_COMPILE_STATUS, &tc_compile_status);
		gl.getShaderiv(m_te_id, GL_COMPILE_STATUS, &te_compile_status);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() failed");

		if (tc_compile_status != GL_TRUE)
		{
			TCU_FAIL("Could not compile tessellation control shader");
		}

		if (te_compile_status != GL_TRUE)
		{
			TCU_FAIL("Could not compile tessellation evaluation shader");
		}

		/* Try to link the program object */
		glw::GLint link_status = GL_FALSE;

		gl.linkProgram(m_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() failed");

		gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() failed");

		if (link_status != GL_TRUE)
		{
			TCU_FAIL("Program linking failed");
		}

		/* Query the tessellation properties of the program object and make sure
		 * the values reported are valid */
		glw::GLint control_output_vertices_value = 0;
		glw::GLint gen_mode_value				 = GL_NONE;
		glw::GLint gen_spacing_value			 = GL_NONE;
		glw::GLint gen_vertex_order_value		 = GL_NONE;
		glw::GLint gen_point_mode_value			 = GL_NONE;

		gl.getProgramiv(m_po_id, m_glExtTokens.TESS_CONTROL_OUTPUT_VERTICES, &control_output_vertices_value);
		gl.getProgramiv(m_po_id, m_glExtTokens.TESS_GEN_MODE, &gen_mode_value);
		gl.getProgramiv(m_po_id, m_glExtTokens.TESS_GEN_SPACING, &gen_spacing_value);
		gl.getProgramiv(m_po_id, m_glExtTokens.TESS_GEN_POINT_MODE, &gen_point_mode_value);
		gl.getProgramiv(m_po_id, m_glExtTokens.TESS_GEN_VERTEX_ORDER, &gen_vertex_order_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() for tessellation-specific properties failed.");

		if (control_output_vertices_value != test.expected_control_output_vertices_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid value reported for GL_TESS_CONTROL_OUTPUT_VERTICES_EXT property; "
							   << " expected: " << test.expected_control_output_vertices_value
							   << ", retrieved: " << control_output_vertices_value << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported for GL_TESS_CONTROL_OUTPUT_VERTICES_EXT property.");
		}

		if ((glw::GLuint)gen_mode_value != test.expected_gen_mode_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value reported for GL_TESS_GEN_MODE_EXT property; "
							   << " expected: " << test.expected_gen_mode_value << ", retrieved: " << gen_mode_value
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported for GL_TESS_GEN_MODE_EXT property.");
		}

		if ((glw::GLuint)gen_spacing_value != test.expected_gen_spacing_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid value reported for GL_TESS_GEN_SPACING_EXT property; "
							   << " expected: " << test.expected_gen_spacing_value
							   << ", retrieved: " << gen_spacing_value << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported for GL_TESS_GEN_SPACING_EXT property.");
		}

		if ((glw::GLuint)gen_point_mode_value != test.expected_gen_point_mode_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid value reported for GL_TESS_GEN_POINT_MODE_EXT property; "
							   << " expected: " << test.expected_gen_point_mode_value
							   << ", retrieved: " << gen_point_mode_value << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported for GL_TESS_GEN_POINT_MODE_EXT property.");
		}

		if ((glw::GLuint)gen_vertex_order_value != test.expected_gen_vertex_order_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid value reported for GL_TESS_GEN_VERTEX_ORDER_EXT property; "
							   << " expected: " << test.expected_gen_vertex_order_value
							   << ", retrieved: " << gen_vertex_order_value << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported for GL_TESS_GEN_VERTEX_ORDER_EXT property.");
		}
	} /* for (all test descriptors) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}